

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

void __thiscall
booster::locale::util::gregorian_calendar::adjust_value
          (gregorian_calendar *this,period_mark p,update_type u,int difference)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  int addon;
  int value;
  int max_diff;
  int cur_max;
  int cur_min;
  int local_28;
  
  if (in_EDX == 0) {
    switch(in_ESI) {
    case 2:
    case 3:
      *(int *)((long)in_RDI + 100) = in_ECX + *(int *)((long)in_RDI + 100);
      break;
    case 4:
      *(int *)(in_RDI + 0xc) = in_ECX + (int)in_RDI[0xc];
      break;
    case 5:
    case 6:
    case 7:
    case 9:
      *(int *)((long)in_RDI + 0x5c) = in_ECX + *(int *)((long)in_RDI + 0x5c);
      break;
    case 8:
    case 0xf:
    case 0x10:
      *(int *)((long)in_RDI + 0x5c) = in_ECX * 7 + *(int *)((long)in_RDI + 0x5c);
      break;
    case 10:
    case 0xb:
      *(int *)(in_RDI + 0xb) = in_ECX + (int)in_RDI[0xb];
      break;
    case 0xc:
      *(int *)(in_RDI + 0xb) = in_ECX * 0xc + (int)in_RDI[0xb];
      break;
    case 0xd:
      *(int *)((long)in_RDI + 0x54) = in_ECX + *(int *)((long)in_RDI + 0x54);
      break;
    case 0xe:
      *(int *)(in_RDI + 10) = in_ECX + (int)in_RDI[10];
    }
    *(undefined1 *)(in_RDI + 0x11) = 0;
    (**(code **)(*in_RDI + 0x10))();
  }
  else if (in_EDX == 1) {
    iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_ESI,1);
    iVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_ESI,5);
    iVar2 = (iVar2 - iVar1) + 1;
    if (0 < iVar2) {
      iVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_ESI,3);
      local_28 = 0;
      if (in_ECX < 0) {
        local_28 = (-in_ECX / iVar2 + 1) * iVar2;
      }
      (**(code **)(*in_RDI + 8))
                (in_RDI,in_ESI,((iVar3 - iVar1) + in_ECX + local_28) % iVar2 + iVar1);
      (**(code **)(*in_RDI + 0x10))();
    }
  }
  return;
}

Assistant:

virtual void adjust_value(period::marks::period_mark p,update_type u,int difference)
            {
                switch(u) {
                case move:
                    {
                        using namespace period::marks;
                        switch(p) {
                        case year:                       ///< Year, it is calendar specific
                        case extended_year:              ///< Extended year for Gregorian/Julian calendars, where 1 BC == 0, 2 BC == -1.
                            tm_updated_.tm_year +=difference;
                            break;
                        case month:
                            tm_updated_.tm_mon +=difference;
                            break;
                        case day:
                        case day_of_year:
                        case day_of_week:                ///< Day of week, starting from Sunday, [1..7]
                        case day_of_week_local: ///< Local day of week, for example in France Monday is 1, in US Sunday is 1, [1..7]
                            tm_updated_.tm_mday +=difference;
                            break;
                        case hour:                       ///< 24 clock hour [0..23]
                        case hour_12:                    ///< 12 clock hour [0..11]
                            tm_updated_.tm_hour += difference;
                            break;
                        case am_pm:                      ///< am or pm marker, [0..1]
                            tm_updated_.tm_hour += 12 * difference;
                            break;
                        case minute:                     ///< minute [0..59]
                            tm_updated_.tm_min += difference;
                            break;
                        case second:
                            tm_updated_.tm_sec += difference;
                            break;
                        case week_of_year:               ///< The week number in the year
                        case week_of_month:              ///< The week number withing current month
                        case day_of_week_in_month:       ///< Original number of the day of the week in month.
                            tm_updated_.tm_mday +=difference * 7;
                            break;
                        default:
                            ; // Not all values are adjustable
                        }
                        normalized_ = false;
                        normalize();
                    }
                    break;
                case roll:
                    { // roll
                        int cur_min = get_value(p,actual_minimum);
                        int cur_max = get_value(p,actual_maximum);
                        int max_diff = cur_max - cur_min + 1;
                        if(max_diff > 0) {
                            int value = get_value(p,current);
                            int addon = 0;
                            if(difference < 0)
                                addon = ((-difference/max_diff) + 1) * max_diff;
                            value = (value - cur_min + difference + addon) % max_diff + cur_min;
                            set_value(p,value);
                            normalize();
                        }
                    }
                default:
                    ;
                }
            }